

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O1

string * __thiscall lest::to_string_abi_cxx11_(string *__return_storage_ptr__,lest *this,char **txt)

{
  size_type sVar1;
  long *plVar2;
  long *plVar3;
  ulong *puVar4;
  allocator local_91;
  ulong *local_90;
  undefined8 local_88;
  ulong local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,*(char **)this,&local_91);
  make_tran_string(&local_50,&local_30);
  plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x25b3d3);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_60 = *plVar3;
    lStack_58 = plVar2[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar3;
    local_70 = (long *)*plVar2;
  }
  local_68 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_70);
  puVar4 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar4) {
    local_80 = *puVar4;
    lStack_78 = plVar2[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *puVar4;
    local_90 = (ulong *)*plVar2;
  }
  sVar1 = plVar2[1];
  *plVar2 = (long)puVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_90 == &local_80) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_80;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lStack_78;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_90;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_80;
  }
  __return_storage_ptr__->_M_string_length = sVar1;
  local_88 = 0;
  local_80 = local_80 & 0xffffffffffffff00;
  local_90 = &local_80;
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string to_string( char const *   const & txt ) { return "\"" + make_tran_string(                 txt   ) + "\""; }